

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack29_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined1 auVar17 [64];
  
  auVar11 = *(undefined1 (*) [32])(in + 1);
  auVar12 = vpmovsxbd_avx512f(_DAT_00194250);
  uVar3 = *in;
  auVar5 = *(undefined1 (*) [16])(in + 9);
  auVar13 = vpmovsxbd_avx512f(_DAT_001a0df0);
  auVar14 = vpmovsxbd_avx512f(_DAT_001a0e00);
  auVar9 = vpsllvd_avx2(auVar11,_DAT_0019d0c0);
  auVar8 = vpsllvd_avx2(auVar5,_DAT_001a0d20);
  auVar9 = vpand_avx2(auVar9,_DAT_0019d7a0);
  auVar8 = vpand_avx(auVar8,_DAT_001a0d30);
  *out = uVar3 & 0x1fffffff;
  auVar12 = vpermi2d_avx512f(auVar12,ZEXT3264(auVar11),ZEXT464(uVar3));
  uVar1 = *(ulong *)(in + 0xe);
  auVar15 = vpbroadcastd_avx512f(ZEXT416(0x1fffffff));
  auVar12 = vpermi2d_avx512f(auVar13,auVar12,ZEXT1664(auVar5));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5 = vpsllvd_avx2(auVar5,_DAT_001a0d40);
  auVar7._8_8_ = 0x1fff00001fffe000;
  auVar7._0_8_ = 0x1fff00001fffe000;
  auVar5 = vpandq_avx512vl(auVar5,auVar7);
  auVar13 = vpbroadcastd_avx512f();
  auVar16._0_56_ = auVar12._0_56_;
  auVar16._56_4_ = auVar13._56_4_;
  auVar16._60_4_ = auVar12._60_4_;
  auVar12 = vpermi2d_avx512f(auVar14,auVar16,ZEXT864(uVar1));
  auVar12 = vpsrlvd_avx512f(auVar12,_DAT_001b2f80);
  auVar13 = vpmovsxbd_avx512f(_DAT_001a0e10);
  auVar14 = vmovdqa32_avx512f(auVar15);
  auVar14 = ZEXT4064(CONCAT436(auVar14._36_4_,CONCAT432(0,auVar9)));
  auVar13 = vpermi2d_avx512f(auVar13,auVar14,ZEXT1664(auVar8));
  auVar16 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar17 = vpbroadcastd_avx512f();
  auVar18._0_52_ = auVar13._0_52_;
  auVar18._52_4_ = auVar17._52_4_;
  auVar18._56_4_ = auVar13._56_4_;
  auVar18._60_4_ = auVar13._60_4_;
  auVar13 = vpermi2q_avx512f(auVar16,auVar18,ZEXT1664(auVar5));
  auVar11 = vpmovsxbd_avx2(ZEXT816(0x302010009));
  auVar13 = vpord_avx512f(auVar12,auVar13);
  uVar2 = *(ulong *)(in + 0x15);
  auVar12 = vpandd_avx512f(auVar12,auVar14);
  auVar14._0_36_ = auVar13._0_36_;
  auVar14._36_4_ = auVar12._36_4_;
  auVar14._40_4_ = auVar13._40_4_;
  auVar14._44_4_ = auVar13._44_4_;
  auVar14._48_4_ = auVar13._48_4_;
  auVar14._52_4_ = auVar13._52_4_;
  auVar14._56_4_ = auVar13._56_4_;
  auVar14._60_4_ = auVar13._60_4_;
  auVar5 = *(undefined1 (*) [16])(in + 0x10);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar2;
  auVar8 = vpsllvd_avx2(auVar22,_DAT_001a0d80);
  auVar12 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])(out + 1) = auVar12;
  auVar7 = vpsllvd_avx2(auVar5,_DAT_001a0d60);
  auVar6._8_8_ = 0x1fffff001fffffe0;
  auVar6._0_8_ = 0x1fffff001fffffe0;
  auVar6 = vpandq_avx512vl(auVar8,auVar6);
  auVar8 = vpand_avx(auVar7,_DAT_001a0d70);
  auVar9 = vpermi2d_avx512vl(auVar11,ZEXT1632(auVar5),ZEXT832(uVar1));
  auVar11 = vpmovsxbd_avx2(ZEXT816(0xe040403020100));
  auVar10 = vpbroadcastd_avx512vl();
  uVar1 = *(ulong *)(in + 0x1b);
  auVar11 = vpermi2d_avx512vl(auVar11,auVar9,auVar10);
  uVar21 = (undefined4)uVar2;
  auVar9._4_4_ = uVar21;
  auVar9._0_4_ = uVar21;
  auVar9._8_4_ = uVar21;
  auVar9._12_4_ = uVar21;
  auVar9._16_4_ = uVar21;
  auVar9._20_4_ = uVar21;
  auVar9._24_4_ = uVar21;
  auVar9._28_4_ = uVar21;
  auVar11 = vpblendd_avx2(auVar11,auVar9,0x80);
  auVar10 = vpsrlvd_avx2(auVar11,_DAT_0019d7e0);
  auVar11 = vpblendd_avx2(ZEXT1632(auVar8),auVar15._0_32_,0x10);
  auVar9 = vpbroadcastd_avx512vl();
  auVar11 = vpblendd_avx2(auVar11,auVar9,0x20);
  uVar23 = auVar6._0_8_;
  auVar20._8_8_ = uVar23;
  auVar20._0_8_ = uVar23;
  auVar20._16_8_ = uVar23;
  auVar20._24_8_ = uVar23;
  auVar11 = vpblendd_avx2(auVar11,auVar20,0xc0);
  auVar9 = vpor_avx2(auVar10,auVar11);
  auVar11 = vpand_avx2(auVar10,auVar15._0_32_);
  auVar11 = vpblendd_avx2(auVar9,auVar11,0x10);
  auVar8 = vpmovsxbd_avx(ZEXT416(0x2010005));
  *(undefined1 (*) [32])(out + 0x11) = auVar11;
  auVar5 = *(undefined1 (*) [16])(in + 0x17);
  auVar7 = vpermi2d_avx512vl(auVar8,auVar5,auVar22);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1;
  auVar8 = vpalignr_avx(auVar19,auVar5,0xc);
  auVar5 = vpshldvd_avx512_vbmi2(auVar5,auVar7,_DAT_001a0db0);
  auVar7 = vpsrlvd_avx2(auVar8,_DAT_001a0dc0);
  auVar5 = vpand_avx(auVar5,auVar15._0_16_);
  auVar8 = vpsllvd_avx2(auVar19,_DAT_001a0dd0);
  auVar4._8_8_ = 0x1c0000001f800000;
  auVar4._0_8_ = 0x1c0000001f800000;
  auVar8 = vpternlogq_avx512vl(auVar8,auVar7,auVar4,0xec);
  *(undefined1 (*) [16])(out + 0x19) = auVar5;
  *(long *)(out + 0x1d) = auVar8._0_8_;
  out[0x1f] = (uint)(uVar1 >> 0x23);
  return in + 0x1d;
}

Assistant:

const uint32_t *__fastunpack29_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 26)) << (29 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 23)) << (29 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 20)) << (29 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 17)) << (29 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 14)) << (29 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 11)) << (29 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 8)) << (29 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 5)) << (29 - 5);
  out++;
  *out = ((*in) >> 5);
  ++in;
  *out |= ((*in) % (1U << 2)) << (29 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 29);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 28)) << (29 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 25)) << (29 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 22)) << (29 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 19)) << (29 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 16)) << (29 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 13)) << (29 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 10)) << (29 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 7)) << (29 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 4)) << (29 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 1)) << (29 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 29);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 27)) << (29 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 24)) << (29 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 21)) << (29 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 18)) << (29 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 15)) << (29 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 12)) << (29 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 9)) << (29 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 6)) << (29 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 3)) << (29 - 3);
  out++;
  *out = ((*in) >> 3);
  ++in;
  out++;

  return in;
}